

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamReaderPrivate::SetRegion(BamReaderPrivate *this,BamRegion *region)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int *in_stack_00000028;
  BamRegion *in_stack_00000030;
  BamRandomAccessController *in_stack_00000038;
  string message;
  string bracError;
  BamRandomAccessController *in_stack_ffffffffffffff18;
  allocator *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  string local_60 [32];
  string local_40 [36];
  undefined4 local_1c;
  byte local_1;
  
  sVar2 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::size
                    ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                     &in_RDI[1]._M_string_length);
  local_1c = (undefined4)sVar2;
  bVar1 = BamRandomAccessController::SetRegion
                    (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    BamRandomAccessController::GetErrorString_abi_cxx11_(in_stack_ffffffffffffff18);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,"could not set region: \n\t",(allocator *)__rhs);
    std::operator+(in_RDI,__rhs);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator(&local_81);
    paVar3 = &local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"BamReader::SetRegion",paVar3);
    SetErrorString((BamReaderPrivate *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    local_1 = 0;
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool BamReaderPrivate::SetRegion(const BamRegion& region) {

    if ( m_randomAccessController.SetRegion(region, m_references.size()) )
        return true;
    else {
        const string bracError = m_randomAccessController.GetErrorString();
        const string message = string("could not set region: \n\t") + bracError;
        SetErrorString("BamReader::SetRegion", message);
        return false;
    }
}